

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O3

void Cbs0_ManStop(Cbs0_Man_t *p)

{
  Vec_Int_t *__ptr;
  int *__ptr_00;
  Gia_Obj_t **ppGVar1;
  
  __ptr = p->vModel;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  ppGVar1 = (p->pProp).pData;
  if (ppGVar1 != (Gia_Obj_t **)0x0) {
    free(ppGVar1);
    (p->pProp).pData = (Gia_Obj_t **)0x0;
  }
  ppGVar1 = (p->pJust).pData;
  if (ppGVar1 != (Gia_Obj_t **)0x0) {
    free(ppGVar1);
  }
  free(p);
  return;
}

Assistant:

void Cbs0_ManStop( Cbs0_Man_t * p )
{
    Vec_IntFree( p->vModel );
    ABC_FREE( p->pProp.pData );
    ABC_FREE( p->pJust.pData );
    ABC_FREE( p );
}